

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglSwapBuffersWithDamageTests.cpp
# Opt level: O2

void __thiscall
deqp::egl::anon_unknown_0::SwapBuffersWithDamageAndBufferAgeTest::checkExtension
          (SwapBuffersWithDamageAndBufferAgeTest *this,Library *egl,EGLDisplay eglDisplay)

{
  bool bVar1;
  NotSupportedError *this_00;
  allocator<char> local_39;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"EGL_KHR_swap_buffers_with_damage",&local_39);
  bVar1 = eglu::hasExtension(egl,eglDisplay,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"EGL_EXT_buffer_age",&local_39);
    bVar1 = eglu::hasExtension(egl,eglDisplay,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    if (bVar1) {
      return;
    }
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"EGL_EXT_buffer_age not supported",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersWithDamageTests.cpp"
               ,0x231);
  }
  else {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"EGL_KHR_swap_buffers_with_damage is not supported",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersWithDamageTests.cpp"
               ,0x22e);
  }
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void SwapBuffersWithDamageAndBufferAgeTest::checkExtension (const Library& egl, EGLDisplay eglDisplay)
{
	if (!eglu::hasExtension(egl, eglDisplay, "EGL_KHR_swap_buffers_with_damage"))
		TCU_THROW(NotSupportedError, "EGL_KHR_swap_buffers_with_damage is not supported");

	if (!eglu::hasExtension(egl, eglDisplay, "EGL_EXT_buffer_age"))
		TCU_THROW(NotSupportedError, "EGL_EXT_buffer_age not supported");
}